

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uamqp_messaging.c
# Opt level: O1

int message_create_IoTHubMessage_from_uamqp_message
              (MESSAGE_HANDLE uamqp_message,IOTHUB_MESSAGE_HANDLE *iothubclient_message)

{
  bool bVar1;
  BINARY_DATA *pBVar2;
  int iVar3;
  AMQP_TYPE AVar4;
  IOTHUB_MESSAGE_RESULT IVar5;
  int iVar6;
  MAP_RESULT MVar7;
  LOGGER_LOG p_Var8;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle;
  MAP_HANDLE handle;
  AMQP_VALUE map;
  size_t __n;
  uint uVar9;
  char *pcVar10;
  bool bVar11;
  char *string_value;
  AMQP_VALUE uamqp_message_property;
  PROPERTIES_HANDLE uamqp_message_properties;
  uint32_t property_count;
  uint64_t ulong_value;
  MESSAGE_BODY_TYPE body_type;
  BINARY_DATA binary_data;
  BINARY_DATA *local_f8;
  AMQP_VALUE local_f0;
  PROPERTIES_HANDLE local_e8;
  uint32_t local_dc;
  amqp_binary local_d8;
  MESSAGE_BODY_TYPE local_bc;
  BINARY_DATA local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  iVar3 = message_get_body_type(uamqp_message,&local_bc);
  if (iVar3 == 0) {
    if (local_bc != MESSAGE_BODY_TYPE_DATA) {
      iVar3 = 0x471;
      goto LAB_0014312a;
    }
    iVar3 = message_get_body_amqp_data_in_place(uamqp_message,0,&local_b8);
    if (iVar3 == 0) {
      iotHubMessageHandle = IoTHubMessage_CreateFromByteArray(local_b8.bytes,local_b8.length);
      if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
        p_Var8 = xlogging_get_log_function();
        iVar3 = 0x488;
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar10 = 
          "Failed creating the IOTHUB_MESSAGE_HANDLE instance (IoTHubMessage_CreateFromByteArray failed)."
          ;
          iVar6 = 0x487;
          goto LAB_001430c8;
        }
        goto LAB_0014312a;
      }
      iVar3 = 0x471;
    }
    else {
      p_Var8 = xlogging_get_log_function();
      iVar3 = 0x483;
      if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0014312a;
      pcVar10 = "Failed to get the body of the uamqp message.";
      iVar6 = 0x482;
LAB_001430c8:
      iotHubMessageHandle = (IOTHUB_MESSAGE_HANDLE)0x0;
      (*p_Var8)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                ,"message_create_IoTHubMessage_from_uamqp_message",iVar6,1,pcVar10);
    }
  }
  else {
    p_Var8 = xlogging_get_log_function();
    iVar3 = 0x479;
    if (p_Var8 != (LOGGER_LOG)0x0) {
      pcVar10 = "Failed to get the type of the uamqp message.";
      iVar6 = 0x478;
      goto LAB_001430c8;
    }
LAB_0014312a:
    iotHubMessageHandle = (IOTHUB_MESSAGE_HANDLE)0x0;
  }
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    return iVar3;
  }
  iVar3 = message_get_properties(uamqp_message,&local_e8);
  if (iVar3 != 0) {
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 != (LOGGER_LOG)0x0) {
      (*p_Var8)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                ,"readPropertiesFromuAMQPMessage",999,1,
                "Failed to get property properties map from uAMQP message.");
    }
    goto LAB_001438c1;
  }
  iVar3 = properties_get_message_id(local_e8,&local_f0);
  if ((local_f0 != (AMQP_VALUE)0x0 && iVar3 == 0) &&
     (AVar4 = amqpvalue_get_type(local_f0), AVar4 != AMQP_TYPE_NULL)) {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8.bytes = (uchar *)0x0;
    local_b8.length = 0;
    if (AVar4 == AMQP_TYPE_ULONG) {
      iVar3 = amqpvalue_get_ulong(local_f0,(uint64_t *)&local_d8);
      if (iVar3 != 0) {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar10 = "Failed to get value of uAMQP message \'message-id\' property (ulong)";
          iVar3 = 0x313;
LAB_00143368:
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readMessageIdFromuAQMPMessage",iVar3,1,pcVar10);
        }
        goto LAB_00143373;
      }
      iVar3 = sprintf((char *)&local_b8,"%lu",local_d8.bytes);
      pBVar2 = &local_b8;
      if (iVar3 < 0) {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar10 = "Failed converting \'message-id\' (ulong) to string";
          iVar3 = 0x318;
          goto LAB_00143368;
        }
        goto LAB_00143373;
      }
LAB_0014337c:
      local_f8 = pBVar2;
      bVar1 = false;
    }
    else {
      if (AVar4 != AMQP_TYPE_UUID) {
        if (AVar4 == AMQP_TYPE_STRING) {
          iVar3 = amqpvalue_get_string(local_f0,(char **)&local_f8);
          pBVar2 = local_f8;
          if (iVar3 == 0) goto LAB_0014337c;
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed to get value of uAMQP message \'message-id\' property (string)";
            iVar3 = 0x309;
            goto LAB_00143368;
          }
        }
        else {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar10 = "Unrecognized type for message-id (%d)";
            iVar3 = 0x335;
            goto LAB_00143368;
          }
        }
LAB_00143373:
        local_f8 = (BINARY_DATA *)0x0;
        pBVar2 = local_f8;
        goto LAB_0014337c;
      }
      iVar3 = amqpvalue_get_uuid(local_f0,(uuid *)&local_d8);
      if (iVar3 != 0) {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar10 = "Failed to get value of uAMQP message \'message-id\' property (UUID)";
          iVar3 = 0x326;
          goto LAB_00143368;
        }
        goto LAB_00143373;
      }
      local_f8 = (BINARY_DATA *)UUID_to_string((UUID_T *)&local_d8);
      bVar1 = true;
      if (local_f8 == (BINARY_DATA *)0x0) {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar10 = "Failed to get the string representation of \'message-id\' UUID";
          iVar3 = 0x32b;
          goto LAB_00143368;
        }
        goto LAB_00143373;
      }
    }
    if (local_f8 == (BINARY_DATA *)0x0) {
      p_Var8 = xlogging_get_log_function();
      iVar3 = 0x34e;
      if (p_Var8 != (LOGGER_LOG)0x0) {
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"readMessageIdFromuAQMPMessage",0x34d,1,"Unexpected null string for message-id");
      }
    }
    else {
      IVar5 = IoTHubMessage_SetMessageId(iotHubMessageHandle,(char *)local_f8);
      if (IVar5 == IOTHUB_MESSAGE_OK) {
        iVar3 = 0;
      }
      else {
        p_Var8 = xlogging_get_log_function();
        iVar3 = 0x33e;
        if (p_Var8 != (LOGGER_LOG)0x0) {
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readMessageIdFromuAQMPMessage",0x33d,1,
                    "Failed to set IOTHUB_MESSAGE_HANDLE \'message-id\' property.");
        }
      }
      if (bVar1) {
        free(local_f8);
      }
    }
    if (iVar3 == 0) goto LAB_00143455;
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 != (LOGGER_LOG)0x0) {
      pcVar10 = "Failed readMessageIdFromuAQMPMessage.";
      iVar3 = 0x3f0;
LAB_001437ad:
      (*p_Var8)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                ,"readPropertiesFromuAMQPMessage",iVar3,1,pcVar10);
    }
LAB_001437b8:
    properties_destroy(local_e8);
LAB_001438c1:
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 != (LOGGER_LOG)0x0) {
      (*p_Var8)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                ,"message_create_IoTHubMessage_from_uamqp_message",0x491,1,
                "Failed reading properties of the uamqp message.");
    }
    IoTHubMessage_Destroy(iotHubMessageHandle);
    return 0x493;
  }
LAB_00143455:
  iVar3 = properties_get_correlation_id(local_e8,&local_f0);
  if ((local_f0 != (AMQP_VALUE)0x0 && iVar3 == 0) &&
     (AVar4 = amqpvalue_get_type(local_f0), AVar4 != AMQP_TYPE_NULL)) {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8.bytes = (uchar *)0x0;
    local_b8.length = 0;
    if (AVar4 == AMQP_TYPE_ULONG) {
      iVar3 = amqpvalue_get_ulong(local_f0,(uint64_t *)&local_d8);
      if (iVar3 != 0) {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar10 = "Failed to get value of uAMQP message \'correlation-id\' property (ulong)";
          iVar3 = 0x37d;
LAB_001435dc:
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readCorrelationIdFromuAQMPMessage",iVar3,1,pcVar10);
        }
        goto LAB_001435e7;
      }
      iVar3 = sprintf((char *)&local_b8,"%lu",local_d8.bytes);
      pBVar2 = &local_b8;
      if (iVar3 < 0) {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar10 = "Failed converting \'correlation-id\' (ulong) to string";
          iVar3 = 0x382;
          goto LAB_001435dc;
        }
        goto LAB_001435e7;
      }
LAB_001435f0:
      local_f8 = pBVar2;
      bVar1 = false;
    }
    else {
      if (AVar4 != AMQP_TYPE_UUID) {
        if (AVar4 == AMQP_TYPE_STRING) {
          iVar3 = amqpvalue_get_string(local_f0,(char **)&local_f8);
          pBVar2 = local_f8;
          if (iVar3 == 0) goto LAB_001435f0;
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed to get value of uAMQP message \'correlation-id\' property (string)";
            iVar3 = 0x373;
            goto LAB_001435dc;
          }
        }
        else {
          p_Var8 = xlogging_get_log_function();
          if (p_Var8 != (LOGGER_LOG)0x0) {
            pcVar10 = "Unrecognized type for correlation-id (%d)";
            iVar3 = 0x39f;
            goto LAB_001435dc;
          }
        }
LAB_001435e7:
        local_f8 = (BINARY_DATA *)0x0;
        pBVar2 = local_f8;
        goto LAB_001435f0;
      }
      iVar3 = amqpvalue_get_uuid(local_f0,(uuid *)&local_d8);
      if (iVar3 != 0) {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar10 = "Failed to get value of uAMQP message \'correlation-id\' property (UUID)";
          iVar3 = 0x390;
          goto LAB_001435dc;
        }
        goto LAB_001435e7;
      }
      local_f8 = (BINARY_DATA *)UUID_to_string((UUID_T *)&local_d8);
      bVar1 = true;
      if (local_f8 == (BINARY_DATA *)0x0) {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar10 = "Failed to get the string representation of \'correlation-id\' UUID";
          iVar3 = 0x395;
          goto LAB_001435dc;
        }
        goto LAB_001435e7;
      }
    }
    if (local_f8 == (BINARY_DATA *)0x0) {
      p_Var8 = xlogging_get_log_function();
      iVar3 = 0x3b8;
      if (p_Var8 != (LOGGER_LOG)0x0) {
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"readCorrelationIdFromuAQMPMessage",0x3b7,1,
                  "Unexpected null string for correlation-id");
      }
    }
    else {
      IVar5 = IoTHubMessage_SetCorrelationId(iotHubMessageHandle,(char *)local_f8);
      if (IVar5 == IOTHUB_MESSAGE_OK) {
        iVar3 = 0;
      }
      else {
        p_Var8 = xlogging_get_log_function();
        iVar3 = 0x3a8;
        if (p_Var8 != (LOGGER_LOG)0x0) {
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readCorrelationIdFromuAQMPMessage",0x3a7,1,
                    "Failed to set IOTHUB_MESSAGE_HANDLE \'correlation-id\' property.");
        }
      }
      if (bVar1) {
        free(local_f8);
      }
    }
    if (iVar3 != 0) {
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 != (LOGGER_LOG)0x0) {
        pcVar10 = "Failed readCorrelationIdFromuAQMPMessage.";
        iVar3 = 0x3f5;
        goto LAB_001437ad;
      }
      goto LAB_001437b8;
    }
  }
  iVar3 = properties_get_user_id(local_e8,&local_d8);
  if (local_d8.length != 0 && iVar3 == 0) {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8.bytes = (uchar *)0x0;
    local_b8.length = 0;
    __n = 0x7f;
    if (local_d8.length < 0x7f) {
      __n = (size_t)local_d8.length;
    }
    strncpy((char *)&local_b8,(char *)local_d8.bytes,__n);
    IVar5 = IoTHubMessage_SetMessageUserIdSystemProperty(iotHubMessageHandle,(char *)&local_b8);
    if (IVar5 != IOTHUB_MESSAGE_OK) {
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 != (LOGGER_LOG)0x0) {
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                  ,"readUserIdFromuAQMPMessage",0x3d4,1,
                  "Failed to set IOTHUB_MESSAGE_HANDLE \'user-id\' property.");
      }
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 != (LOGGER_LOG)0x0) {
        pcVar10 = "Failed readUserIdFromuAQMPMessage.";
        iVar3 = 0x3fa;
        goto LAB_001437ad;
      }
      goto LAB_001437b8;
    }
  }
  local_b8.bytes = (uchar *)0x0;
  iVar6 = properties_get_content_type(local_e8,(char **)&local_b8);
  iVar3 = 0;
  if ((local_b8.bytes != (uchar *)0x0 && iVar6 == 0) &&
     (IVar5 = IoTHubMessage_SetContentTypeSystemProperty(iotHubMessageHandle,(char *)local_b8.bytes)
     , iVar3 = 0, IVar5 != IOTHUB_MESSAGE_OK)) {
    p_Var8 = xlogging_get_log_function();
    iVar3 = 0x406;
    if (p_Var8 != (LOGGER_LOG)0x0) {
      (*p_Var8)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                ,"readPropertiesFromuAMQPMessage",0x405,1,
                "Failed to set IOTHUB_MESSAGE_HANDLE \'content-type\' property.");
    }
  }
  local_b8.bytes = (uchar *)0x0;
  iVar6 = properties_get_content_encoding(local_e8,(char **)&local_b8);
  if ((local_b8.bytes != (uchar *)0x0 && iVar6 == 0) &&
     (IVar5 = IoTHubMessage_SetContentEncodingSystemProperty
                        (iotHubMessageHandle,(char *)local_b8.bytes), IVar5 != IOTHUB_MESSAGE_OK)) {
    p_Var8 = xlogging_get_log_function();
    iVar3 = 0x411;
    if (p_Var8 != (LOGGER_LOG)0x0) {
      (*p_Var8)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                ,"readPropertiesFromuAMQPMessage",0x410,1,
                "Failed to set IOTHUB_MESSAGE_HANDLE \'content-encoding\' property.");
    }
  }
  properties_destroy(local_e8);
  if (iVar3 != 0) goto LAB_001438c1;
  local_b8.bytes = (uchar *)0x0;
  local_dc = 0;
  handle = IoTHubMessage_Properties(iotHubMessageHandle);
  if (handle == (MAP_HANDLE)0x0) {
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_001439b0;
    pcVar10 = "Failed to get property map from IoTHub message.";
    iVar3 = 0x426;
  }
  else {
    iVar3 = message_get_application_properties(uamqp_message,(AMQP_VALUE *)&local_b8);
    if (iVar3 == 0) {
      if ((AMQP_VALUE)local_b8.bytes == (AMQP_VALUE)0x0) {
LAB_00143dcb:
        *iothubclient_message = iotHubMessageHandle;
        return 0;
      }
      map = amqpvalue_get_inplace_described_value((AMQP_VALUE)local_b8.bytes);
      if (map == (AMQP_VALUE)0x0) {
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          iVar3 = 0;
          pcVar10 = 
          "Failed getting the map of uAMQP message application properties (return code %d).";
          iVar6 = 0x438;
LAB_00143b85:
          (*p_Var8)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"readApplicationPropertiesFromuAMQPMessage",iVar6,1,pcVar10,iVar3);
        }
      }
      else {
        iVar3 = amqpvalue_get_map_pair_count(map,&local_dc);
        if (iVar3 == 0) {
          if (local_dc == 0) {
            amqpvalue_destroy((AMQP_VALUE)local_b8.bytes);
          }
          else {
            uVar9 = 1;
            do {
              local_d8.bytes = (AMQP_VALUE)0x0;
              local_f0 = (AMQP_VALUE)0x0;
              iVar3 = amqpvalue_get_map_key_value_pair
                                (map,uVar9 - 1,(AMQP_VALUE *)&local_d8,&local_f0);
              if (iVar3 == 0) {
                iVar3 = amqpvalue_get_string((AMQP_VALUE)local_d8.bytes,(char **)&local_f8);
                if (iVar3 == 0) {
                  iVar3 = amqpvalue_get_string(local_f0,(char **)&local_e8);
                  if (iVar3 == 0) {
                    MVar7 = Map_AddOrUpdate(handle,(char *)local_f8,(char *)local_e8);
                    bVar1 = true;
                    if (MVar7 == MAP_OK) goto LAB_00143d84;
                    p_Var8 = xlogging_get_log_function();
                    if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_00143d81;
                    iVar3 = 0x45e;
                    pcVar10 = "Failed to add/update IoTHub message property map.";
                  }
                  else {
                    p_Var8 = xlogging_get_log_function();
                    if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_00143d81;
                    iVar3 = 0x459;
                    pcVar10 = "Failed parsing the uAMQP property value (return code %d).";
                  }
LAB_00143d7a:
                  bVar1 = false;
                  (*p_Var8)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                            ,"readApplicationPropertiesFromuAMQPMessage",iVar3,1,pcVar10);
                }
                else {
                  p_Var8 = xlogging_get_log_function();
                  if (p_Var8 != (LOGGER_LOG)0x0) {
                    iVar3 = 0x454;
                    pcVar10 = "Failed parsing the uAMQP property name (return code %d).";
                    goto LAB_00143d7a;
                  }
LAB_00143d81:
                  bVar1 = false;
                }
LAB_00143d84:
                amqpvalue_destroy((AMQP_VALUE)local_d8.bytes);
                amqpvalue_destroy(local_f0);
              }
              else {
                p_Var8 = xlogging_get_log_function();
                if (p_Var8 == (LOGGER_LOG)0x0) {
                  bVar1 = false;
                }
                else {
                  bVar1 = false;
                  (*p_Var8)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                            ,"readApplicationPropertiesFromuAMQPMessage",0x44c,1,
                            "Failed reading the key/value pair from the uAMQP property map (return code %d)."
                            ,iVar3);
                }
              }
            } while ((bVar1) && (bVar11 = uVar9 < local_dc, uVar9 = uVar9 + 1, bVar11));
            amqpvalue_destroy((AMQP_VALUE)local_b8.bytes);
            if (!bVar1) goto LAB_001439b0;
          }
          goto LAB_00143dcb;
        }
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 != (LOGGER_LOG)0x0) {
          pcVar10 = 
          "Failed reading the number of values in the uAMQP property map (return code %d).";
          iVar6 = 0x43d;
          goto LAB_00143b85;
        }
      }
      amqpvalue_destroy((AMQP_VALUE)local_b8.bytes);
      goto LAB_001439b0;
    }
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_001439b0;
    pcVar10 = "Failed reading the incoming uAMQP message properties (return code %d).";
    iVar3 = 0x42b;
  }
  (*p_Var8)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
            ,"readApplicationPropertiesFromuAMQPMessage",iVar3,1,pcVar10);
LAB_001439b0:
  p_Var8 = xlogging_get_log_function();
  if (p_Var8 != (LOGGER_LOG)0x0) {
    (*p_Var8)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
              ,"message_create_IoTHubMessage_from_uamqp_message",0x497,1,
              "Failed reading application properties of the uamqp message.");
  }
  IoTHubMessage_Destroy(iotHubMessageHandle);
  return 0x499;
}

Assistant:

int message_create_IoTHubMessage_from_uamqp_message(MESSAGE_HANDLE uamqp_message, IOTHUB_MESSAGE_HANDLE* iothubclient_message)
{
    int result = MU_FAILURE;

    IOTHUB_MESSAGE_HANDLE iothub_message = NULL;
    MESSAGE_BODY_TYPE body_type;

    if (message_get_body_type(uamqp_message, &body_type) != 0)
    {
        LogError("Failed to get the type of the uamqp message.");
        result = MU_FAILURE;
    }
    else
    {
        if (body_type == MESSAGE_BODY_TYPE_DATA)
        {
            BINARY_DATA binary_data;
            if (message_get_body_amqp_data_in_place(uamqp_message, 0, &binary_data) != 0)
            {
                LogError("Failed to get the body of the uamqp message.");
                result = MU_FAILURE;
            }
            else if ((iothub_message = IoTHubMessage_CreateFromByteArray(binary_data.bytes, binary_data.length)) == NULL)
            {
                LogError("Failed creating the IOTHUB_MESSAGE_HANDLE instance (IoTHubMessage_CreateFromByteArray failed).");
                result = MU_FAILURE;
            }
        }
    }

    if (iothub_message != NULL)
    {
        if (readPropertiesFromuAMQPMessage(iothub_message, uamqp_message) != RESULT_OK)
        {
            LogError("Failed reading properties of the uamqp message.");
            IoTHubMessage_Destroy(iothub_message);
            result = MU_FAILURE;
        }
        else if (readApplicationPropertiesFromuAMQPMessage(iothub_message, uamqp_message) != RESULT_OK)
        {
            LogError("Failed reading application properties of the uamqp message.");
            IoTHubMessage_Destroy(iothub_message);
            result = MU_FAILURE;
        }
        else
        {
            *iothubclient_message = iothub_message;
            result = RESULT_OK;
        }
    }

    return result;
}